

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader_tests.cc
# Opt level: O0

void __thiscall
lf::io::test::lf_ioDeathTest_earthRefined_Test::TestBody(lf_ioDeathTest_earthRefined_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *message;
  char *regex;
  AssertHelper local_140;
  Message local_138;
  int local_12c;
  exception *gtest_exception;
  string local_f8;
  GmshReader local_d8;
  ReturnSentinel local_50;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_30;
  pointer local_18;
  DeathTest *gtest_dt;
  lf_ioDeathTest_earthRefined_Test *this_local;
  
  gtest_dt = (DeathTest *)this;
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_00177353;
  testing::internal::MakeDeathTestMatcher_abi_cxx11_
            (&local_30,(internal *)"Mesh is incomplete",regex);
  bVar1 = testing::internal::DeathTest::Create
                    ("test_utils::getGmshReader(\"earth_refined.msh\", 2)",&local_30,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/test/gmsh_reader_tests.cc"
                     ,0x13f,&local_18);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_30);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00177353;
  if (local_18 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&gtest_sentinel,local_18);
  iVar2 = (*local_18->_vptr_DeathTest[2])();
  if (iVar2 == 0) {
    iVar2 = (*local_18->_vptr_DeathTest[3])();
    bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
    uVar3 = (*local_18->_vptr_DeathTest[4])(local_18,(ulong)bVar1);
    if ((uVar3 & 1) != 0) goto LAB_0017731b;
    local_12c = 2;
  }
  else {
    if (iVar2 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_50,local_18);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"earth_refined.msh",
                   (allocator<char> *)((long)&gtest_exception + 7));
        test_utils::getGmshReader(&local_d8,&local_f8,2);
        GmshReader::~GmshReader(&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_exception + 7));
      }
      (*local_18->_vptr_DeathTest[5])(local_18,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_50);
    }
LAB_0017731b:
    local_12c = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                 *)&gtest_sentinel);
  if (local_12c == 0) {
    return;
  }
LAB_00177353:
  testing::Message::Message(&local_138);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_140,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/test/gmsh_reader_tests.cc"
             ,0x13f,message);
  testing::internal::AssertHelper::operator=(&local_140,&local_138);
  testing::internal::AssertHelper::~AssertHelper(&local_140);
  testing::Message::~Message(&local_138);
  return;
}

Assistant:

TEST(lf_ioDeathTest, earthRefined) {
  // Make sure that gmsh reader can read earth_refined, but expect that hybrid
  // mesh factory will throw an error:
  ASSERT_DEATH(test_utils::getGmshReader("earth_refined.msh", 2),
               "Mesh is incomplete");
}